

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O0

string * __thiscall
TargetFilesystemArtifactResultCreator<ArtifactBundleDirTag>::Create_abi_cxx11_
          (string *__return_storage_ptr__,
          TargetFilesystemArtifactResultCreator<ArtifactBundleDirTag> *this,
          cmGeneratorTarget *target,cmGeneratorExpressionContext *context,
          GeneratorExpressionContent *content)

{
  GeneratorExpressionContent *pGVar1;
  bool bVar2;
  string local_108;
  undefined1 local_e8 [8];
  string outpath;
  string local_c0;
  string local_a0;
  allocator<char> local_69;
  string local_68;
  string local_48;
  cmGeneratorExpressionContext *local_28;
  GeneratorExpressionContent *content_local;
  cmGeneratorExpressionContext *context_local;
  cmGeneratorTarget *target_local;
  
  local_28 = context;
  content_local = (GeneratorExpressionContent *)target;
  context_local = (cmGeneratorExpressionContext *)this;
  target_local = (cmGeneratorTarget *)__return_storage_ptr__;
  bVar2 = cmGeneratorTarget::IsImported((cmGeneratorTarget *)this);
  pGVar1 = content_local;
  if (bVar2) {
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
              (&local_48,(GeneratorExpressionContent *)local_28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"TARGET_BUNDLE_DIR not allowed for IMPORTED targets.",&local_69);
    reportError((cmGeneratorExpressionContext *)pGVar1,&local_48,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::allocator<char>::~allocator(&local_69);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  else {
    bVar2 = cmGeneratorTarget::IsBundleOnApple((cmGeneratorTarget *)context_local);
    pGVar1 = content_local;
    if (bVar2) {
      cmGeneratorTarget::GetDirectory
                (&local_108,(cmGeneratorTarget *)context_local,
                 (string *)
                 &content_local[3].ParamChildren.
                  super__Vector_base<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,RuntimeBinaryArtifact);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8,
                     &local_108,'/');
      std::__cxx11::string::~string((string *)&local_108);
      cmGeneratorTarget::BuildBundleDirectory
                (__return_storage_ptr__,(cmGeneratorTarget *)context_local,(string *)local_e8,
                 (string *)
                 &content_local[3].ParamChildren.
                  super__Vector_base<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,BundleDirLevel);
      std::__cxx11::string::~string((string *)local_e8);
    }
    else {
      GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
                (&local_a0,(GeneratorExpressionContent *)local_28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c0,"TARGET_BUNDLE_DIR is allowed only for Bundle targets.",
                 (allocator<char> *)(outpath.field_2._M_local_buf + 0xf));
      reportError((cmGeneratorExpressionContext *)pGVar1,&local_a0,&local_c0);
      std::__cxx11::string::~string((string *)&local_c0);
      std::allocator<char>::~allocator((allocator<char> *)(outpath.field_2._M_local_buf + 0xf));
      std::__cxx11::string::~string((string *)&local_a0);
      std::__cxx11::string::string((string *)__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string Create(cmGeneratorTarget* target,
                            cmGeneratorExpressionContext* context,
                            const GeneratorExpressionContent* content)
  {
    if (target->IsImported()) {
      ::reportError(context, content->GetOriginalExpression(),
                    "TARGET_BUNDLE_DIR not allowed for IMPORTED targets.");
      return std::string();
    }
    if (!target->IsBundleOnApple()) {
      ::reportError(context, content->GetOriginalExpression(),
                    "TARGET_BUNDLE_DIR is allowed only for Bundle targets.");
      return std::string();
    }

    std::string outpath = target->GetDirectory(context->Config) + '/';
    return target->BuildBundleDirectory(outpath, context->Config,
                                        cmGeneratorTarget::BundleDirLevel);
  }